

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

String * __thiscall
stick::String::concatWithAllocator<stick::String,stick::String>
          (String *__return_storage_ptr__,String *this,Allocator *_alloc,String *_args,
          String *_args_1)

{
  char *__src;
  char *__s;
  _func_int **pp_Var1;
  ulong uVar2;
  
  uVar2 = _args->m_length + (long)_alloc[1]._vptr_Allocator;
  __return_storage_ptr__->m_cStr = (char *)0x0;
  __return_storage_ptr__->m_length = 0;
  __return_storage_ptr__->m_capacity = 0;
  __return_storage_ptr__->m_allocator = (Allocator *)this;
  if (uVar2 < __return_storage_ptr__->m_length) {
    __return_storage_ptr__->m_cStr[uVar2] = '\0';
  }
  if (__return_storage_ptr__->m_capacity < uVar2) {
    __src = __return_storage_ptr__->m_cStr;
    __s = (char *)(**(code **)(this->m_cStr + 0x10))(this,uVar2 + 1,1);
    __return_storage_ptr__->m_cStr = __s;
    memset(__s,0,uVar2 + 1);
    if (__return_storage_ptr__->m_cStr == (char *)0x0) {
      __assert_fail("m_cStr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                    ,0x1a0,"void stick::String::reserve(Size)");
    }
    if (__src != (char *)0x0) {
      strcpy(__return_storage_ptr__->m_cStr,__src);
      (*__return_storage_ptr__->m_allocator->_vptr_Allocator[3])();
    }
    __return_storage_ptr__->m_capacity = uVar2;
  }
  __return_storage_ptr__->m_length = uVar2;
  if (_alloc->_vptr_Allocator == (_func_int **)0x0) {
    pp_Var1 = (_func_int **)0x0;
  }
  else {
    strcpy(__return_storage_ptr__->m_cStr,(char *)_alloc->_vptr_Allocator);
    pp_Var1 = _alloc[1]._vptr_Allocator;
  }
  if (_args->m_cStr != (char *)0x0) {
    strcpy((char *)((long)pp_Var1 + (long)__return_storage_ptr__->m_cStr),_args->m_cStr);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String String::concatWithAllocator(Allocator & _alloc, Strings... _args)
{
    Size len = 0;
    int unpack[]{ 0, (len += detail::_StringCopier::strLen(_args), 0)... };
    STICK_UNUSED(unpack);
    String ret(_alloc);
    ret.resize(len);
    Size off = 0;
    int unpack2[]{ 0, (detail::_StringCopier::performCopy(ret, off, _args))... };
    STICK_UNUSED(unpack2);
    return ret;
}